

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

Group * __thiscall
Assimp::Blender::Structure::_allocate<Assimp::Blender::Group>
          (Structure *this,shared_ptr<Assimp::Blender::Group> *out,size_t *s)

{
  Group *this_00;
  element_type *peVar1;
  shared_ptr<Assimp::Blender::Group> local_30;
  size_t *local_20;
  size_t *s_local;
  shared_ptr<Assimp::Blender::Group> *out_local;
  Structure *this_local;
  
  local_20 = s;
  s_local = (size_t *)out;
  out_local = (shared_ptr<Assimp::Blender::Group> *)this;
  this_00 = (Group *)operator_new(0x440);
  memset(this_00,0,0x440);
  Group::Group(this_00);
  ::std::shared_ptr<Assimp::Blender::Group>::shared_ptr<Assimp::Blender::Group,void>
            (&local_30,this_00);
  ::std::shared_ptr<Assimp::Blender::Group>::operator=
            ((shared_ptr<Assimp::Blender::Group> *)s_local,&local_30);
  ::std::shared_ptr<Assimp::Blender::Group>::~shared_ptr(&local_30);
  *local_20 = 1;
  peVar1 = ::std::__shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<Assimp::Blender::Group,_(__gnu_cxx::_Lock_policy)2> *)s_local);
  return peVar1;
}

Assistant:

T* _allocate(std::shared_ptr<T>& out, size_t& s) const {
        out = std::shared_ptr<T>(new T());
        s = 1;
        return out.get();
    }